

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O3

void printBar(int np,string *pstr)

{
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
  if (0 < np) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(pstr->_M_dataplus)._M_p,pstr->_M_string_length);
      np = np + -1;
    } while (np != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
  return;
}

Assistant:

void printBar(int np, const std::string pstr)
{
	std::cout << "|";
	for (int i = 0; i < np; i++)
		std::cout << pstr;
	std::cout << "|" << std::endl;
	std::cout << "|";
}